

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::WriteDouble(Builder *this,double f,uint8_t byte_width)

{
  uint8_t byte_width_local;
  double f_local;
  Builder *this_local;
  
  if (byte_width == '\x04') {
    Write<float>(this,(float)f,4);
  }
  else {
    if (byte_width != '\b') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                    ,0x5ae,"void flexbuffers::Builder::WriteDouble(double, uint8_t)");
    }
    Write<double>(this,f,8);
  }
  return;
}

Assistant:

void WriteDouble(double f, uint8_t byte_width) {
    switch (byte_width) {
      case 8: Write(f, byte_width); break;
      case 4: Write(static_cast<float>(f), byte_width); break;
      // case 2: Write(static_cast<half>(f), byte_width); break;
      // case 1: Write(static_cast<quarter>(f), byte_width); break;
      default: FLATBUFFERS_ASSERT(0);
    }
  }